

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

int Sfm_TimPriorityNodes(Sfm_Tim_t *p,Vec_Int_t *vCands,int Window)

{
  Vec_Wec_t *p_00;
  Abc_Ntk_t *pAVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pAVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  if (100 < (uint)Window) {
    __assert_fail("Window >= 0 && Window <= 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                  ,0x17b,"int Sfm_TimPriorityNodes(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  Sfm_TimCriticalPath(p,Window);
  p_00 = &p->vLevels;
  iVar7 = 0;
  do {
    if ((p->vLevels).nSize <= iVar7) {
      iVar7 = 0;
      do {
        if ((p->vPath).nSize <= iVar7) {
          qsort((p->vLevels).pArray,(long)(p->vLevels).nSize,0x10,Vec_WecSortCompare1);
          vCands->nSize = 0;
          for (iVar7 = 0; iVar7 < (p->vLevels).nSize; iVar7 = iVar7 + 1) {
            pVVar4 = Vec_WecEntry(p_00,iVar7);
            for (iVar8 = 0; iVar8 < pVVar4->nSize; iVar8 = iVar8 + 1) {
              pAVar1 = p->pNtk;
              iVar3 = Vec_IntEntry(pVVar4,iVar8);
              pAVar5 = Abc_NtkObj(pAVar1,iVar3);
              if ((pAVar5 != (Abc_Obj_t *)0x0) && ((pAVar5->field_0x14 & 0x10) == 0)) {
                Vec_IntPush(vCands,pAVar5->Id);
              }
            }
          }
          return (int)(0 < vCands->nSize);
        }
        pAVar1 = p->pNtk;
        iVar8 = Vec_IntEntry(&p->vPath,iVar7);
        pAVar5 = Abc_NtkObj(pAVar1,iVar8);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          uVar9 = *(uint *)&pAVar5->field_0x14;
          if ((uVar9 & 0x40) != 0) {
            __assert_fail("pObj->fMarkC == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                          ,0x182,"int Sfm_TimPriorityNodes(Sfm_Tim_t *, Vec_Int_t *, int)");
          }
          *(uint *)&pAVar5->field_0x14 = uVar9 | 0x40;
          uVar9 = uVar9 >> 0xc;
          iVar8 = pAVar5->Id;
          iVar3 = (p->vLevels).nSize;
          if (iVar3 <= (int)uVar9) {
            uVar6 = uVar9 + 1;
            uVar2 = iVar3 * 2;
            if ((int)uVar2 <= (int)uVar6) {
              uVar2 = uVar6;
            }
            iVar3 = p_00->nCap;
            if (iVar3 < (int)uVar2) {
              pVVar4 = (p->vLevels).pArray;
              if (pVVar4 == (Vec_Int_t *)0x0) {
                pVVar4 = (Vec_Int_t *)malloc((ulong)uVar2 << 4);
              }
              else {
                pVVar4 = (Vec_Int_t *)realloc(pVVar4,(ulong)uVar2 << 4);
                iVar3 = p_00->nCap;
              }
              (p->vLevels).pArray = pVVar4;
              memset(pVVar4 + iVar3,0,(long)(int)(uVar2 - iVar3) << 4);
              (p->vLevels).nCap = uVar2;
            }
            (p->vLevels).nSize = uVar6;
          }
          pVVar4 = Vec_WecEntry(p_00,uVar9);
          Vec_IntPush(pVVar4,iVar8);
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
    pVVar4 = Vec_WecEntry(p_00,iVar7);
    for (iVar8 = 0; iVar8 < pVVar4->nSize; iVar8 = iVar8 + 1) {
      pAVar1 = p->pNtk;
      iVar3 = Vec_IntEntry(pVVar4,iVar8);
      pAVar5 = Abc_NtkObj(pAVar1,iVar3);
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        if ((*(uint *)&pAVar5->field_0x14 & 0x40) == 0) {
          __assert_fail("pObj->fMarkC == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                        ,299,"void Sfm_TimUpdateClean(Sfm_Tim_t *)");
        }
        *(uint *)&pAVar5->field_0x14 = *(uint *)&pAVar5->field_0x14 & 0xffffffbf;
      }
    }
    pVVar4->nSize = 0;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

int Sfm_TimPriorityNodes( Sfm_Tim_t * p, Vec_Int_t * vCands, int Window )
{
    Vec_Int_t * vLevel;
    Abc_Obj_t * pObj;
    int i, k;
    assert( Window >= 0 && Window <= 100 );
    // collect critical path
    Sfm_TimCriticalPath( p, Window );
    // add nodes to the levelized structure
    Sfm_TimUpdateClean( p );
    Abc_NtkForEachObjVec( &p->vPath, p->pNtk, pObj, i )
    {
        assert( pObj->fMarkC == 0 );
        pObj->fMarkC = 1;
        Vec_WecPush( &p->vLevels, Abc_ObjLevel(pObj), Abc_ObjId(pObj) );
    }
    // prioritize nodes by expected gain
    Vec_WecSort( &p->vLevels, 0 );
    Vec_IntClear( vCands );
    Vec_WecForEachLevel( &p->vLevels, vLevel, i )
        Abc_NtkForEachObjVec( vLevel, p->pNtk, pObj, k )
            if ( !pObj->fMarkA )
                Vec_IntPush( vCands, Abc_ObjId(pObj) );
//    printf( "Path = %5d   Cand = %5d\n", Vec_IntSize(&p->vPath) );
    return Vec_IntSize(vCands) > 0;
}